

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int zisofs_init(archive_write *a,isofile *file)

{
  long lVar1;
  size_t __size;
  void *pvVar2;
  int iVar3;
  uchar *p;
  la_int64_t lVar4;
  ulong uVar5;
  void *pvVar6;
  int iVar7;
  size_t size;
  
  pvVar2 = a->format_data;
  *(byte *)((long)pvVar2 + 0x1d8) = *(byte *)((long)pvVar2 + 0x1d8) & 0xfc;
  iVar7 = 0;
  if ((*(uint *)((long)pvVar2 + 0x10370) >> 0x1a & 1) != 0 &&
      (*(uint *)((long)pvVar2 + 0x10370) & 0x1800000) != 0) {
    lVar4 = archive_entry_size(file->entry);
    if ((0x17 < lVar4) && (lVar4 = archive_entry_size(file->entry), lVar4 < 0x100000000)) {
      *(byte *)((long)pvVar2 + 0x1d8) = *(byte *)((long)pvVar2 + 0x1d8) | 1;
      *(undefined4 *)((long)pvVar2 + 0x21c) = 0;
    }
    iVar7 = 0;
    if (((*(byte *)((long)pvVar2 + 0x1d8) & 1) != 0) &&
       (lVar4 = archive_entry_size(file->entry), 0x800 < lVar4)) {
      iVar3 = zisofs_init_zstream(a);
      iVar7 = -0x1e;
      if (iVar3 == 0) {
        (file->zisofs).header_size = '\x04';
        (file->zisofs).log2_bs = '\x0f';
        uVar5 = archive_entry_size(file->entry);
        (file->zisofs).uncompressed_size = (uint32_t)uVar5;
        iVar3 = (int)((uVar5 & 0xffffffff) + 0x7fff >> ((file->zisofs).log2_bs & 0x3f));
        *(int *)((long)pvVar2 + 0x230) = iVar3 + 1;
        *(undefined4 *)((long)pvVar2 + 0x234) = 0;
        lVar1 = (long)iVar3 * 4;
        __size = lVar1 + 4;
        if (*(ulong *)((long)pvVar2 + 0x228) < __size) {
          free(*(void **)((long)pvVar2 + 0x220));
          pvVar6 = malloc(__size);
          *(void **)((long)pvVar2 + 0x220) = pvVar6;
          if (pvVar6 == (void *)0x0) {
            archive_set_error(&a->archive,0xc,"Can\'t allocate data");
            return -0x1e;
          }
          *(size_t *)((long)pvVar2 + 0x228) = __size;
        }
        size = lVar1 + 0x14;
        iVar3 = write_null(a,size);
        if (iVar3 == 0) {
          **(undefined4 **)((long)pvVar2 + 0x220) = (int)size;
          *(ulong *)((long)pvVar2 + 0x2c0) = (ulong)(file->zisofs).uncompressed_size;
          *(byte *)((long)pvVar2 + 0x1d8) = *(byte *)((long)pvVar2 + 0x1d8) | 6;
          *(size_t *)((long)pvVar2 + 0x240) = size;
          *(size_t *)((long)pvVar2 + 0x238) = size;
          *(size_t *)(*(long *)(*(long *)((long)pvVar2 + 0x10) + 0xb0) + 8) = size;
          iVar7 = 0;
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static int
zisofs_init(struct archive_write *a,  struct isofile *file)
{
	struct iso9660 *iso9660 = a->format_data;
#ifdef HAVE_ZLIB_H
	uint64_t tsize;
	size_t _ceil, bpsize;
	int r;
#endif

	iso9660->zisofs.detect_magic = 0;
	iso9660->zisofs.making = 0;

	if (!iso9660->opt.rr || !iso9660->opt.zisofs)
		return (ARCHIVE_OK);

	if (archive_entry_size(file->entry) >= 24 &&
	    archive_entry_size(file->entry) < MULTI_EXTENT_SIZE) {
		/* Acceptable file size for zisofs. */
		iso9660->zisofs.detect_magic = 1;
		iso9660->zisofs.magic_cnt = 0;
	}
	if (!iso9660->zisofs.detect_magic)
		return (ARCHIVE_OK);

#ifdef HAVE_ZLIB_H
	/* The number of Logical Blocks which uncompressed data
	 * will use in iso-image file is the same as the number of
	 * Logical Blocks which zisofs(compressed) data will use
	 * in ISO-image file. It won't reduce iso-image file size. */
	if (archive_entry_size(file->entry) <= LOGICAL_BLOCK_SIZE)
		return (ARCHIVE_OK);

	/* Initialize compression library */
	r = zisofs_init_zstream(a);
	if (r != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Mark file->zisofs to create RRIP 'ZF' Use Entry. */
	file->zisofs.header_size = ZF_HEADER_SIZE >> 2;
	file->zisofs.log2_bs = ZF_LOG2_BS;
	file->zisofs.uncompressed_size =
		(uint32_t)archive_entry_size(file->entry);

	/* Calculate a size of Block Pointers of zisofs. */
	_ceil = (file->zisofs.uncompressed_size + ZF_BLOCK_SIZE -1)
		>> file->zisofs.log2_bs;
	iso9660->zisofs.block_pointers_cnt = (int)_ceil + 1;
	iso9660->zisofs.block_pointers_idx = 0;

	/* Ensure a buffer size used for Block Pointers */
	bpsize = iso9660->zisofs.block_pointers_cnt *
	    sizeof(iso9660->zisofs.block_pointers[0]);
	if (iso9660->zisofs.block_pointers_allocated < bpsize) {
		free(iso9660->zisofs.block_pointers);
		iso9660->zisofs.block_pointers = malloc(bpsize);
		if (iso9660->zisofs.block_pointers == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate data");
			return (ARCHIVE_FATAL);
		}
		iso9660->zisofs.block_pointers_allocated = bpsize;
	}

	/*
	 * Skip zisofs header and Block Pointers, which we will write
	 * after all compressed data of a file written to the temporary
	 * file.
	 */
	tsize = ZF_HEADER_SIZE + bpsize;
	if (write_null(a, (size_t)tsize) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/*
	 * Initialize some variables to make zisofs.
	 */
	archive_le32enc(&(iso9660->zisofs.block_pointers[0]),
		(uint32_t)tsize);
	iso9660->zisofs.remaining = file->zisofs.uncompressed_size;
	iso9660->zisofs.making = 1;
	iso9660->zisofs.allzero = 1;
	iso9660->zisofs.block_offset = tsize;
	iso9660->zisofs.total_size = tsize;
	iso9660->cur_file->cur_content->size = tsize;
#endif

	return (ARCHIVE_OK);
}